

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O1

void basist::encode_bc1(void *pDst,uint8_t *pPixels,uint32_t flags)

{
  byte bVar1;
  byte bVar2;
  undefined1 auVar3 [16];
  ushort uVar4;
  ushort uVar5;
  bool bVar6;
  uint32_t i_3;
  undefined4 uVar7;
  uint fb;
  uint uVar8;
  uint uVar9;
  long lVar10;
  byte bVar11;
  uint uVar12;
  uint32_t i;
  long lVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint32_t ls_pass;
  int iVar20;
  long lVar21;
  byte *pbVar22;
  float fVar23;
  int iVar24;
  int iVar29;
  float fVar30;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  int iVar32;
  undefined1 in_XMM1 [16];
  undefined1 auVar31 [16];
  float fVar33;
  float fVar34;
  float fVar38;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  int iVar39;
  int iVar44;
  int iVar45;
  undefined1 in_XMM3 [16];
  int iVar46;
  undefined1 auVar41 [16];
  float fVar40;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  int iVar47;
  int iVar48;
  int iVar49;
  int iVar50;
  uint uVar51;
  int iVar52;
  uint uVar53;
  undefined1 in_XMM5 [16];
  float fVar56;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  float fVar62;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  float fVar63;
  undefined1 auVar64 [16];
  int icov [6];
  float cov [6];
  uint8_t sels [16];
  vec3F local_b8;
  int iStack_ac;
  undefined4 local_a8;
  undefined4 uStack_a4;
  undefined1 *local_a0;
  vec3F local_98;
  ulong local_8c;
  undefined4 local_84;
  byte local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 auVar37 [16];
  
  local_a0 = (undefined1 *)pDst;
  if ((flags & 4) == 0) {
    uVar51 = (uint)*pPixels;
    uVar53 = (uint)pPixels[1];
    fb = (uint)pPixels[2];
    lVar21 = 1;
    do {
      if (((pPixels[lVar21 * 4] != *pPixels) || (pPixels[lVar21 * 4 + 1] != pPixels[1])) ||
         (pPixels[lVar21 * 4 + 2] != pPixels[2])) goto LAB_0014ed03;
      lVar21 = lVar21 + 1;
    } while (lVar21 != 0x10);
    lVar21 = 0x10;
LAB_0014ed03:
    if ((int)lVar21 == 0x10) {
      encode_bc1_solid_block(pDst,uVar51,uVar53,fb);
      uVar9 = 0xffffffff;
      uVar14 = 0;
      uVar19 = 0;
    }
    else {
      lVar13 = 1;
      uVar15 = uVar51;
      uVar16 = uVar51;
      uVar12 = uVar53;
      uVar18 = uVar53;
      uVar8 = fb;
      uVar17 = fb;
      do {
        bVar11 = pPixels[lVar13 * 4];
        uVar9 = (uint)bVar11;
        if (uVar51 <= bVar11) {
          uVar51 = uVar9;
        }
        bVar1 = pPixels[lVar13 * 4 + 1];
        uVar14 = (uint)bVar1;
        if (uVar53 <= bVar1) {
          uVar53 = uVar14;
        }
        bVar2 = pPixels[lVar13 * 4 + 2];
        uVar19 = (uint)bVar2;
        if (fb <= bVar2) {
          fb = uVar19;
        }
        if (uVar9 <= uVar16) {
          uVar16 = uVar9;
        }
        if (uVar14 <= uVar12) {
          uVar12 = uVar14;
        }
        if (uVar19 <= uVar8) {
          uVar8 = uVar19;
        }
        uVar15 = uVar15 + bVar11;
        uVar18 = uVar18 + bVar1;
        uVar17 = uVar17 + bVar2;
        lVar13 = lVar13 + 1;
      } while (lVar13 != 0x10);
      uVar15 = uVar15 + 8;
      uVar9 = uVar15 >> 4;
      uVar18 = uVar18 + 8;
      uVar19 = uVar18 >> 4;
      uVar17 = uVar17 + 8;
      uVar14 = uVar17 >> 4;
      iVar39 = 0;
      iVar44 = 0;
      iVar45 = 0;
      iVar46 = 0;
      local_b8.c[1] = 0.0;
      iVar47 = 0;
      iVar48 = 0;
      iVar49 = 0;
      local_b8.c[2] = 0.0;
      iVar52 = 0;
      iVar24 = 0;
      iVar29 = 0;
      iStack_ac = 0;
      iVar32 = 0;
      iVar20 = 0;
      iVar50 = 0;
      lVar13 = 0xe;
      auVar26 = ZEXT416(0);
      auVar43 = (undefined1  [16])0x0;
      do {
        auVar55._8_8_ = 0;
        auVar55._0_8_ =
             (ulong)*(uint *)(pPixels + lVar13 + -0xe) & 0xffffffff000000ff |
             (ulong)pPixels[lVar13 + -10] << 8 | (ulong)pPixels[lVar13 + -6] << 0x10 |
             (ulong)pPixels[lVar13 + -2] << 0x18;
        auVar58 = pmovzxbd(auVar55,auVar55);
        auVar59._0_4_ = auVar58._0_4_ - (uVar15 >> 4);
        auVar59._4_4_ = auVar58._4_4_ - (uVar15 >> 4);
        auVar59._8_4_ = auVar58._8_4_ - (uVar15 >> 4);
        auVar59._12_4_ = auVar58._12_4_ - (uVar15 >> 4);
        auVar58 = ZEXT416(CONCAT13(pPixels[lVar13 + -1],
                                   CONCAT12(pPixels[lVar13 + -5],
                                            CONCAT11(pPixels[lVar13 + -9],pPixels[lVar13 + -0xd]))))
        ;
        auVar58 = pmovzxbd(auVar58,auVar58);
        auVar61 = ZEXT416(CONCAT13(pPixels[lVar13],
                                   CONCAT12(pPixels[lVar13 + -4],
                                            CONCAT11(pPixels[lVar13 + -8],pPixels[lVar13 + -0xc]))))
        ;
        auVar60._0_4_ = auVar58._0_4_ - (uVar18 >> 4);
        auVar60._4_4_ = auVar58._4_4_ - (uVar18 >> 4);
        auVar60._8_4_ = auVar58._8_4_ - (uVar18 >> 4);
        auVar60._12_4_ = auVar58._12_4_ - (uVar18 >> 4);
        auVar58 = pmovzxbd(auVar61,auVar61);
        auVar64._0_4_ = auVar58._0_4_ - (uVar17 >> 4);
        auVar64._4_4_ = auVar58._4_4_ - (uVar17 >> 4);
        auVar64._8_4_ = auVar58._8_4_ - (uVar17 >> 4);
        auVar64._12_4_ = auVar58._12_4_ - (uVar17 >> 4);
        auVar58 = pmulld(auVar59,auVar59);
        iVar39 = iVar39 + auVar58._0_4_;
        iVar44 = iVar44 + auVar58._4_4_;
        iVar45 = iVar45 + auVar58._8_4_;
        iVar46 = iVar46 + auVar58._12_4_;
        auVar58 = pmulld(auVar60,auVar59);
        local_b8.c[1] = (float)((int)local_b8.c[1] + auVar58._0_4_);
        iVar47 = iVar47 + auVar58._4_4_;
        iVar48 = iVar48 + auVar58._8_4_;
        iVar49 = iVar49 + auVar58._12_4_;
        auVar58 = pmulld(auVar59,auVar64);
        local_b8.c[2] = (float)((int)local_b8.c[2] + auVar58._0_4_);
        iVar52 = iVar52 + auVar58._4_4_;
        iVar24 = iVar24 + auVar58._8_4_;
        iVar29 = iVar29 + auVar58._12_4_;
        auVar58 = pmulld(auVar64,auVar60);
        auVar61 = pmulld(auVar60,auVar60);
        iStack_ac = iStack_ac + auVar61._0_4_;
        iVar32 = iVar32 + auVar61._4_4_;
        iVar20 = iVar20 + auVar61._8_4_;
        iVar50 = iVar50 + auVar61._12_4_;
        auVar61._0_4_ = auVar43._0_4_ + auVar58._0_4_;
        auVar61._4_4_ = auVar43._4_4_ + auVar58._4_4_;
        auVar61._8_4_ = auVar43._8_4_ + auVar58._8_4_;
        auVar61._12_4_ = auVar43._12_4_ + auVar58._12_4_;
        auVar43 = pmulld(auVar64,auVar64);
        auVar58._0_4_ = auVar26._0_4_ + auVar43._0_4_;
        auVar58._4_4_ = auVar26._4_4_ + auVar43._4_4_;
        auVar58._8_4_ = auVar26._8_4_ + auVar43._8_4_;
        auVar58._12_4_ = auVar26._12_4_ + auVar43._12_4_;
        lVar13 = lVar13 + 0x10;
        auVar26 = auVar58;
        auVar43 = auVar61;
      } while (lVar13 != 0x4e);
      auVar54._0_4_ = iVar45 + iVar39;
      auVar54._4_4_ = iVar46 + iVar44;
      auVar54._8_4_ = iVar45 * 2;
      auVar54._12_4_ = iVar46 * 2;
      auVar43._0_4_ = iVar48 + (int)local_b8.c[1];
      auVar43._4_4_ = iVar49 + iVar47;
      auVar43._8_4_ = iVar48 * 2;
      auVar43._12_4_ = iVar49 * 2;
      auVar55 = phaddd(auVar54,auVar43);
      auVar41._0_4_ = iVar24 + (int)local_b8.c[2];
      auVar41._4_4_ = iVar29 + iVar52;
      auVar41._8_4_ = iVar24 * 2;
      auVar41._12_4_ = iVar29 * 2;
      auVar26._0_4_ = iVar20 + iStack_ac;
      auVar26._4_4_ = iVar50 + iVar32;
      auVar26._8_4_ = iVar20 * 2;
      auVar26._12_4_ = iVar50 * 2;
      auVar43 = phaddd(auVar41,auVar26);
      auVar26 = phaddd(auVar61,auVar61);
      auVar61 = phaddd(auVar26,auVar26);
      auVar26 = phaddd(auVar58,auVar58);
      auVar26 = phaddd(auVar26,auVar26);
      local_b8.c[1] = auVar55._8_4_;
      local_b8.c[0] = auVar55._0_4_;
      local_b8.c[2] = auVar43._0_4_;
      iStack_ac = auVar43._8_4_;
      _local_a8 = CONCAT44(auVar26._0_4_,auVar61._0_4_);
      lVar13 = 0;
      do {
        local_98.c[lVar13] = (float)(int)local_b8.c[lVar13] * 0.003921569;
        lVar13 = lVar13 + 1;
      } while (lVar13 != 6);
      fVar40 = (float)(int)(uVar53 - uVar12);
      fVar56 = 0.0;
      fVar33 = (float)(int)(fb - uVar8);
      in_XMM5._4_4_ = local_98.c[2];
      in_XMM5._0_4_ = local_98.c[2];
      in_XMM5._8_8_ = 0;
      auVar57._4_4_ = local_84;
      auVar57._0_4_ = local_84;
      auVar57._8_8_ = 0;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = local_8c;
      auVar26 = insertps(auVar57,auVar3,0x4c);
      iVar32 = 4;
      fVar34 = (float)(int)(uVar51 - uVar16);
      fVar30 = 0.0;
      fVar38 = 0.0;
      do {
        fVar23 = fVar33 * local_98.c[2] + fVar40 * local_98.c[1] + fVar34 * local_98.c[0];
        fVar62 = fVar40 * (float)(local_8c >> 0x20);
        fVar63 = fVar56 * 0.0;
        fVar40 = fVar33 * auVar26._0_4_ + fVar40 * (float)local_8c + fVar34 * local_98.c[1];
        fVar33 = fVar33 * auVar26._4_4_ + fVar62 + fVar34 * local_98.c[2];
        fVar56 = fVar38 * auVar26._8_4_ + fVar56 * 0.0 + fVar30 * 0.0;
        fVar62 = fVar38 * auVar26._12_4_ + fVar63 + fVar30 * 0.0;
        iVar32 = iVar32 + -1;
        fVar34 = fVar23;
        fVar30 = fVar38;
        fVar38 = fVar62;
      } while (iVar32 != 0);
      in_XMM3._0_8_ = CONCAT44(fVar33,fVar40) & 0x7fffffff7fffffff;
      in_XMM3._8_4_ = ABS(fVar56);
      in_XMM3._12_4_ = ABS(fVar62);
      fVar34 = ABS(fVar23);
      if (ABS(fVar23) <= ABS(fVar40)) {
        fVar34 = ABS(fVar40);
      }
      if (fVar34 <= ABS(fVar33)) {
        fVar34 = ABS(fVar33);
      }
      if (2.0 <= fVar34) {
        fVar34 = 1024.0 / fVar34;
        iVar32 = (int)(fVar23 * fVar34);
        auVar25._0_4_ = (int)(fVar40 * fVar34);
        auVar25._4_4_ = (int)(fVar33 * fVar34);
        auVar25._8_4_ = (int)(fVar56 * 0.0);
        auVar25._12_4_ = (int)(fVar62 * 0.0);
      }
      else {
        auVar25 = ZEXT816(0x7500000259);
        iVar32 = 0x132;
      }
      iVar20 = -0x80000000;
      lVar13 = 0;
      iVar50 = 0;
      iVar52 = 0;
      iVar24 = 0x7fffffff;
      do {
        auVar26 = pmovzxbd(ZEXT216(*(ushort *)(pPixels + lVar13 * 4 + 1)),
                           ZEXT216(*(ushort *)(pPixels + lVar13 * 4 + 1)));
        in_XMM1 = pmulld(auVar26,auVar25);
        iVar39 = in_XMM1._4_4_ + in_XMM1._0_4_ + (uint)pPixels[lVar13 * 4] * iVar32;
        iVar29 = iVar24;
        if (iVar39 < iVar24) {
          iVar29 = iVar39;
        }
        if (iVar39 < iVar24) {
          iVar52 = (int)lVar13;
        }
        if (iVar20 < iVar39) {
          iVar50 = (int)lVar13;
          iVar20 = iVar39;
        }
        lVar13 = lVar13 + 1;
        iVar24 = iVar29;
      } while (lVar13 != 0x10);
      lVar10 = (long)iVar52;
      lVar13 = (long)iVar50;
      bc1_find_sels((color32 *)pPixels,
                    (uint)pPixels[lVar10 * 4] * 0x1f +
                    ((uint)pPixels[lVar10 * 4] * 0x1f + 0x80 >> 8) + 0x80 >> 8,
                    ((uint)pPixels[lVar10 * 4 + 1] * 0x3f + 0x80 >> 8) +
                    (uint)pPixels[lVar10 * 4 + 1] * 0x3f + 0x80 >> 8,
                    ((uint)pPixels[lVar10 * 4 + 2] * 0x1f + 0x80 >> 8) +
                    (uint)pPixels[lVar10 * 4 + 2] * 0x1f + 0x80 >> 8,
                    ((uint)pPixels[lVar13 * 4] * 0x1f + 0x80 >> 8) +
                    (uint)pPixels[lVar13 * 4] * 0x1f + 0x80 >> 8,
                    ((uint)pPixels[lVar13 * 4 + 1] * 0x3f + 0x80 >> 8) +
                    (uint)pPixels[lVar13 * 4 + 1] * 0x3f + 0x80 >> 8,
                    ((uint)pPixels[lVar13 * 4 + 2] * 0x1f + 0x80 >> 8) +
                    (uint)pPixels[lVar13 * 4 + 2] * 0x1f + 0x80 >> 8,local_78);
    }
    if ((int)lVar21 == 0x10) {
      return;
    }
  }
  else {
    uVar9 = *(uint *)((long)pDst + 4);
    pbVar22 = local_78;
    uVar14 = 0;
    lVar21 = 0;
    do {
      *pbVar22 = ""[uVar9 >> ((byte)lVar21 & 0x1f) & 3];
      lVar21 = lVar21 + 2;
      pbVar22 = pbVar22 + 1;
    } while (lVar21 != 0x20);
    uVar9 = 0xffffffff;
    uVar19 = 0;
  }
  iVar32 = 3;
  if ((flags & 2) == 0) {
    iVar32 = (flags & 1) + 1;
  }
  iVar20 = 0;
  pbVar22 = local_78;
  do {
    bVar6 = compute_least_squares_endpoints_rgb((color32 *)pPixels,pbVar22,&local_b8,&local_98);
    if (bVar6) {
      iVar50 = (int)(local_b8.c[0] * 0.12156863 + 0.5);
      iVar52 = (int)(local_b8.c[1] * 0.24705882 + 0.5);
      in_XMM3 = pmovsxbd(in_XMM3,0x3f1f);
      iVar39 = in_XMM3._0_4_;
      uVar51 = (uint)(iVar39 < iVar50) * iVar39 | (uint)(iVar39 >= iVar50) * iVar50;
      iVar44 = in_XMM3._4_4_;
      uVar53 = (uint)(iVar44 < iVar52) * iVar44 | (uint)(iVar44 >= iVar52) * iVar52;
      iVar29 = in_XMM3._8_4_;
      iVar52 = (uint)(iVar29 < 0) * iVar29;
      iVar24 = in_XMM3._12_4_;
      iVar50 = (uint)(iVar24 < 0) * iVar24;
      in_XMM5._4_4_ = (-1 < (int)uVar53) * uVar53;
      in_XMM5._0_4_ = (-1 < (int)uVar51) * uVar51;
      in_XMM5._8_4_ = (uint)(-1 < iVar52) * iVar52;
      in_XMM5._12_4_ = (uint)(-1 < iVar50) * iVar50;
      iVar50 = (int)(local_98.c[0] * 0.12156863 + 0.5);
      iVar52 = (int)(local_98.c[1] * 0.24705882 + 0.5);
      uVar51 = (uint)(iVar39 < iVar50) * iVar39 | (uint)(iVar39 >= iVar50) * iVar50;
      uVar53 = (uint)(iVar44 < iVar52) * iVar44 | (uint)(iVar44 >= iVar52) * iVar52;
      iVar29 = (uint)(iVar29 < 0) * iVar29;
      iVar24 = (uint)(iVar24 < 0) * iVar24;
      in_XMM1._4_4_ = (-1 < (int)uVar53) * uVar53;
      in_XMM1._0_4_ = (-1 < (int)uVar51) * uVar51;
      in_XMM1._8_4_ = (uint)(-1 < iVar29) * iVar29;
      in_XMM1._12_4_ = (uint)(-1 < iVar24) * iVar24;
      auVar26 = insertps(ZEXT416((uint)local_b8.c[2]),local_98.c[2],0x10);
      iVar24 = (int)(auVar26._0_4_ * 0.12156863 + 0.5);
      iVar29 = (int)(auVar26._4_4_ * 0.12156863 + 0.5);
      iVar52 = (int)(auVar26._8_4_ * 0.0 + 0.0);
      iVar50 = (int)(auVar26._12_4_ * 0.0 + 0.0);
      uVar51 = (uint)(0x1f < iVar24) * 0x1f | (uint)(0x1f >= iVar24) * iVar24;
      uVar53 = (uint)(0x1f < iVar29) * 0x1f | (uint)(0x1f >= iVar29) * iVar29;
      iVar52 = (uint)(iVar52 < 1) * iVar52;
      iVar50 = (uint)(iVar50 < 1) * iVar50;
      local_68._4_4_ = (-1 < (int)uVar53) * uVar53;
      local_68._0_4_ = (-1 < (int)uVar51) * uVar51;
      local_68._8_4_ = (uint)(-1 < iVar52) * iVar52;
      local_68._12_4_ = (uint)(-1 < iVar50) * iVar50;
    }
    else {
      if ((int)uVar9 < 0) {
        lVar21 = 0;
        iVar52 = 0;
        iVar24 = 0;
        iVar50 = 0;
        do {
          iVar50 = iVar50 + (uint)pPixels[lVar21 * 4];
          iVar24 = iVar24 + (uint)pPixels[lVar21 * 4 + 1];
          iVar52 = iVar52 + (uint)pPixels[lVar21 * 4 + 2];
          lVar21 = lVar21 + 1;
        } while (lVar21 != 0x10);
        uVar9 = iVar50 + 8U >> 4;
        uVar19 = iVar24 + 8U >> 4;
        uVar14 = iVar52 + 8U >> 4;
      }
      in_XMM5 = pmovzxbd(in_XMM5,ZEXT216(CONCAT11((&g_bc1_match6_equals_1)[(ulong)uVar19 * 2],
                                                  *(undefined1 *)(&g_bc1_match5_equals_1 + uVar9))))
      ;
      in_XMM1 = pmovzxbd(in_XMM1,ZEXT216(CONCAT11((&DAT_0035ed21)[(ulong)uVar19 * 2],
                                                  *(undefined1 *)
                                                   ((long)&g_bc1_match5_equals_1 +
                                                   (ulong)uVar9 * 2 + 1))));
      local_68 = pmovzxbd(ZEXT216((ushort)(&g_bc1_match5_equals_1)[uVar14]),
                          ZEXT216((ushort)(&g_bc1_match5_equals_1)[uVar14]));
    }
    local_58 = in_XMM1;
    local_48 = in_XMM5;
    bc1_find_sels((color32 *)pPixels,in_XMM5._0_4_,in_XMM5._4_4_,local_68._0_4_,in_XMM1._0_4_,
                  in_XMM1._4_4_,local_68._4_4_,pbVar22);
    iVar20 = iVar20 + 1;
  } while (iVar20 != iVar32);
  auVar27._0_4_ = local_48._0_4_ << 5;
  auVar27._4_4_ = local_48._4_4_ << 5;
  auVar27._8_4_ = local_48._8_4_ << 5;
  auVar27._12_4_ = local_48._12_4_ << 5;
  auVar35._0_4_ = local_48._0_4_ << 0xb;
  auVar35._4_4_ = local_48._4_4_ << 0xb;
  auVar35._8_4_ = local_48._8_4_ << 0xb;
  auVar35._12_4_ = local_48._12_4_ << 0xb;
  auVar26 = pblendw(auVar35,auVar27,0xc);
  auVar31._0_4_ = local_58._0_4_ << 5;
  auVar31._4_4_ = local_58._4_4_ << 5;
  auVar31._8_4_ = local_58._8_4_ << 5;
  auVar31._12_4_ = local_58._12_4_ << 5;
  auVar42._0_4_ = local_58._0_4_ << 0xb;
  auVar42._4_4_ = local_58._4_4_ << 0xb;
  auVar42._8_4_ = local_58._8_4_ << 0xb;
  auVar42._12_4_ = local_58._12_4_ << 0xb;
  auVar43 = pblendw(auVar42,auVar31,0xc);
  auVar37._0_8_ = auVar26._0_8_;
  auVar37._8_4_ = auVar26._4_4_;
  auVar37._12_4_ = auVar43._4_4_;
  auVar36._8_8_ = auVar37._8_8_;
  auVar36._0_4_ = auVar26._0_4_;
  auVar36._4_4_ = auVar43._0_4_;
  auVar28._4_4_ = auVar27._4_4_;
  auVar28._0_4_ = auVar27._4_4_;
  auVar28._8_4_ = auVar27._4_4_;
  auVar28._12_4_ = auVar27._4_4_;
  auVar26 = pblendw(auVar28,auVar31,0xc);
  auVar26 = auVar26 | auVar36 | local_68;
  uVar4 = auVar26._0_2_;
  uVar14 = (uint)uVar4;
  uVar5 = auVar26._4_2_;
  uVar19 = (uint)uVar4;
  uVar9 = (uint)uVar5;
  if (uVar19 == uVar5) {
    uVar9 = uVar9 - 1;
    if (uVar5 == 0) {
      uVar14 = 1;
      uVar9 = 0;
    }
    if (uVar14 <= uVar9) {
      __assert_fail("lc16 > hc16",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                    ,0x3afc,"void basist::encode_bc1(void *, const uint8_t *, uint32_t)");
    }
    *local_a0 = (char)uVar14;
    local_a0[1] = (char)(uVar14 >> 8);
    local_a0[2] = (char)uVar9;
    local_a0[3] = (char)(uVar9 >> 8);
    uVar7 = 0;
    if (uVar5 == 0) {
      uVar7 = 0x55555555;
    }
    *(undefined4 *)(local_a0 + 4) = uVar7;
  }
  else {
    uVar51 = 0;
    bVar6 = uVar19 < uVar5;
    uVar14 = uVar9;
    if (!bVar6 && uVar19 != uVar9) {
      uVar14 = (uint)uVar4;
    }
    if (bVar6) {
      uVar9 = (uint)uVar4;
    }
    bVar11 = 0x55;
    if (!bVar6) {
      bVar11 = 0;
    }
    if (uVar14 <= uVar9) {
      __assert_fail("lc16 > hc16",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                    ,0x3b0e,"void basist::encode_bc1(void *, const uint8_t *, uint32_t)");
    }
    *local_a0 = (char)uVar14;
    local_a0[1] = (char)(uVar14 >> 8);
    local_a0[2] = (char)uVar9;
    local_a0[3] = (char)(uVar9 >> 8);
    lVar21 = 0;
    do {
      uVar51 = uVar51 | (uint)""[*pbVar22] << ((byte)lVar21 & 0x1f);
      lVar21 = lVar21 + 2;
      pbVar22 = pbVar22 + 1;
    } while (lVar21 != 0x20);
    local_a0[4] = (byte)uVar51 ^ bVar11;
    local_a0[5] = (byte)(uVar51 >> 8) ^ bVar11;
    local_a0[6] = (byte)(uVar51 >> 0x10) ^ bVar11;
    local_a0[7] = (byte)(uVar51 >> 0x18) ^ bVar11;
  }
  return;
}

Assistant:

void encode_bc1(void* pDst, const uint8_t* pPixels, uint32_t flags)
	{
		const color32* pSrc_pixels = (const color32*)pPixels;
		dxt1_block* pDst_block = static_cast<dxt1_block*>(pDst);
		
		int avg_r = -1, avg_g = 0, avg_b = 0;
		int lr = 0, lg = 0, lb = 0, hr = 0, hg = 0, hb = 0;
		uint8_t sels[16];
		
		const bool use_sels = (flags & cEncodeBC1UseSelectors) != 0;
		if (use_sels)
		{
			// Caller is jamming in their own selectors for us to try.
			const uint32_t s = pDst_block->m_selectors[0] | (pDst_block->m_selectors[1] << 8) | (pDst_block->m_selectors[2] << 16) | (pDst_block->m_selectors[3] << 24);
			
			static const uint8_t s_sel_tran[4] = { 0, 3, 1, 2 };
			
			for (uint32_t i = 0; i < 16; i++)
				sels[i] = s_sel_tran[(s >> (i * 2)) & 3];
		}
		else
		{
			const uint32_t fr = pSrc_pixels[0].r, fg = pSrc_pixels[0].g, fb = pSrc_pixels[0].b;

			uint32_t j;
			for (j = 1; j < 16; j++)
				if ((pSrc_pixels[j].r != fr) || (pSrc_pixels[j].g != fg) || (pSrc_pixels[j].b != fb))
					break;
						
			if (j == 16)
			{
				encode_bc1_solid_block(pDst, fr, fg, fb);
				return;
			}
			
			// Select 2 colors along the principle axis. (There must be a faster/simpler way.)
			int total_r = fr, total_g = fg, total_b = fb;
			int max_r = fr, max_g = fg, max_b = fb;
			int min_r = fr, min_g = fg, min_b = fb;
			for (uint32_t i = 1; i < 16; i++)
			{
				const int r = pSrc_pixels[i].r, g = pSrc_pixels[i].g, b = pSrc_pixels[i].b;
				max_r = basisu::maximum(max_r, r); max_g = basisu::maximum(max_g, g); max_b = basisu::maximum(max_b, b);
				min_r = basisu::minimum(min_r, r); min_g = basisu::minimum(min_g, g); min_b = basisu::minimum(min_b, b);
				total_r += r; total_g += g; total_b += b;
			}

			avg_r = (total_r + 8) >> 4;
			avg_g = (total_g + 8) >> 4;
			avg_b = (total_b + 8) >> 4;

			int icov[6] = { 0, 0, 0, 0, 0, 0 };
			for (uint32_t i = 0; i < 16; i++)
			{
				int r = (int)pSrc_pixels[i].r - avg_r;
				int g = (int)pSrc_pixels[i].g - avg_g;
				int b = (int)pSrc_pixels[i].b - avg_b;
				icov[0] += r * r;
				icov[1] += r * g;
				icov[2] += r * b;
				icov[3] += g * g;
				icov[4] += g * b;
				icov[5] += b * b;
			}

			float cov[6];
			for (uint32_t i = 0; i < 6; i++)
				cov[i] = static_cast<float>(icov[i])* (1.0f / 255.0f);
			
#if 0
			// Seems silly to use full PCA to choose 2 colors. The diff in avg. PSNR between using PCA vs. not is small (~.025 difference).
			// TODO: Try 2 or 3 different normalized diagonal vectors, choose the one that results in the largest dot delta
			int saxis_r = max_r - min_r;
			int saxis_g = max_g - min_g;
			int saxis_b = max_b - min_b;
#else
			float xr = (float)(max_r - min_r);
			float xg = (float)(max_g - min_g);
			float xb = (float)(max_b - min_b);
			//float xr = (float)(max_r - avg_r); // max-avg is nearly the same, and doesn't require computing min's
			//float xg = (float)(max_g - avg_g);
			//float xb = (float)(max_b - avg_b);
			for (uint32_t power_iter = 0; power_iter < 4; power_iter++)
			{
				float r = xr * cov[0] + xg * cov[1] + xb * cov[2];
				float g = xr * cov[1] + xg * cov[3] + xb * cov[4];
				float b = xr * cov[2] + xg * cov[4] + xb * cov[5];
				xr = r; xg = g; xb = b;
			}

			float k = basisu::maximum(fabsf(xr), fabsf(xg), fabsf(xb));
			int saxis_r = 306, saxis_g = 601, saxis_b = 117;
			if (k >= 2)
			{
				float m = 1024.0f / k;
				saxis_r = (int)(xr * m);
				saxis_g = (int)(xg * m);
				saxis_b = (int)(xb * m);
			}
#endif
			
			int low_dot = INT_MAX, high_dot = INT_MIN, low_c = 0, high_c = 0;
			for (uint32_t i = 0; i < 16; i++)
			{
				int dot = pSrc_pixels[i].r * saxis_r + pSrc_pixels[i].g * saxis_g + pSrc_pixels[i].b * saxis_b;
				if (dot < low_dot)
				{
					low_dot = dot;
					low_c = i;
				}
				if (dot > high_dot)
				{
					high_dot = dot;
					high_c = i;
				}
			}

			lr = to_5(pSrc_pixels[low_c].r);
			lg = to_6(pSrc_pixels[low_c].g);
			lb = to_5(pSrc_pixels[low_c].b);

			hr = to_5(pSrc_pixels[high_c].r);
			hg = to_6(pSrc_pixels[high_c].g);
			hb = to_5(pSrc_pixels[high_c].b);
						
			bc1_find_sels(pSrc_pixels, lr, lg, lb, hr, hg, hb, sels);
		} // if (use_sels)

		const uint32_t total_ls_passes = (flags & cEncodeBC1HigherQuality) ? 3 : (flags & cEncodeBC1HighQuality ? 2 : 1);
		for (uint32_t ls_pass = 0; ls_pass < total_ls_passes; ls_pass++)
		{
			// This is where the real magic happens. We have an array of candidate selectors, so let's use least squares to compute the optimal low/high endpoint colors.
			vec3F xl, xh;
			if (!compute_least_squares_endpoints_rgb(pSrc_pixels, sels, &xl, &xh))
			{
				if (avg_r < 0)
				{
					int total_r = 0, total_g = 0, total_b = 0;
					for (uint32_t i = 0; i < 16; i++)
					{
						total_r += pSrc_pixels[i].r;
						total_g += pSrc_pixels[i].g;
						total_b += pSrc_pixels[i].b;
					}

					avg_r = (total_r + 8) >> 4;
					avg_g = (total_g + 8) >> 4;
					avg_b = (total_b + 8) >> 4;
				}

				// All selectors equal - treat it as a solid block which should always be equal or better.
				lr = g_bc1_match5_equals_1[avg_r].m_hi;
				lg = g_bc1_match6_equals_1[avg_g].m_hi;
				lb = g_bc1_match5_equals_1[avg_b].m_hi;

				hr = g_bc1_match5_equals_1[avg_r].m_lo;
				hg = g_bc1_match6_equals_1[avg_g].m_lo;
				hb = g_bc1_match5_equals_1[avg_b].m_lo;

				// In high/higher quality mode, let it try again in case the optimal tables have caused the sels to diverge.
			}
			else
			{
				lr = basisu::clamp((int)((xl.c[0]) * (31.0f / 255.0f) + .5f), 0, 31);
				lg = basisu::clamp((int)((xl.c[1]) * (63.0f / 255.0f) + .5f), 0, 63);
				lb = basisu::clamp((int)((xl.c[2]) * (31.0f / 255.0f) + .5f), 0, 31);

				hr = basisu::clamp((int)((xh.c[0]) * (31.0f / 255.0f) + .5f), 0, 31);
				hg = basisu::clamp((int)((xh.c[1]) * (63.0f / 255.0f) + .5f), 0, 63);
				hb = basisu::clamp((int)((xh.c[2]) * (31.0f / 255.0f) + .5f), 0, 31);
			}
									
			bc1_find_sels(pSrc_pixels, lr, lg, lb, hr, hg, hb, sels);
		}

		uint32_t lc16 = dxt1_block::pack_unscaled_color(lr, lg, lb);
		uint32_t hc16 = dxt1_block::pack_unscaled_color(hr, hg, hb);
				
		// Always forbid 3 color blocks
		if (lc16 == hc16)
		{
			uint8_t mask = 0;

			// Make l > h
			if (hc16 > 0)
				hc16--;
			else
			{
				// lc16 = hc16 = 0
				assert(lc16 == hc16 && hc16 == 0);

				hc16 = 0;
				lc16 = 1;
				mask = 0x55; // select hc16
			}

			assert(lc16 > hc16);
			pDst_block->set_low_color(static_cast<uint16_t>(lc16));
			pDst_block->set_high_color(static_cast<uint16_t>(hc16));

			pDst_block->m_selectors[0] = mask;
			pDst_block->m_selectors[1] = mask;
			pDst_block->m_selectors[2] = mask;
			pDst_block->m_selectors[3] = mask;
		}
		else
		{
			uint8_t invert_mask = 0;
			if (lc16 < hc16)
			{
				std::swap(lc16, hc16);
				invert_mask = 0x55;
			}

			assert(lc16 > hc16);
			pDst_block->set_low_color((uint16_t)lc16);
			pDst_block->set_high_color((uint16_t)hc16);

			uint32_t packed_sels = 0;
			static const uint8_t s_sel_trans[4] = { 0, 2, 3, 1 };
			for (uint32_t i = 0; i < 16; i++)
				packed_sels |= ((uint32_t)s_sel_trans[sels[i]] << (i * 2));

			pDst_block->m_selectors[0] = (uint8_t)packed_sels ^ invert_mask;
			pDst_block->m_selectors[1] = (uint8_t)(packed_sels >> 8) ^ invert_mask;
			pDst_block->m_selectors[2] = (uint8_t)(packed_sels >> 16) ^ invert_mask;
			pDst_block->m_selectors[3] = (uint8_t)(packed_sels >> 24) ^ invert_mask;
		}
	}